

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

ConstTokenOrSyntax * __thiscall
slang::syntax::BinarySequenceExprSyntax::getChild(BinarySequenceExprSyntax *this,size_t index)

{
  Token token;
  long in_RDX;
  ConstTokenOrSyntax *in_RSI;
  Info *in_RDI;
  SyntaxNode *in_stack_ffffffffffffffb8;
  Info *pIVar1;
  
  pIVar1 = in_RDI;
  if (in_RDX == 0) {
    not_null<slang::syntax::SequenceExprSyntax_*>::get
              ((not_null<slang::syntax::SequenceExprSyntax_*> *)(in_RSI + 1));
    ConstTokenOrSyntax::ConstTokenOrSyntax((ConstTokenOrSyntax *)in_RDI,in_stack_ffffffffffffffb8);
  }
  else if (in_RDX == 1) {
    token.info = in_RDI;
    token._0_8_ = in_stack_ffffffffffffffb8;
    ConstTokenOrSyntax::ConstTokenOrSyntax((ConstTokenOrSyntax *)0x4636b5,token);
    pIVar1 = in_RDI;
  }
  else if (in_RDX == 2) {
    not_null<slang::syntax::SequenceExprSyntax_*>::get
              ((not_null<slang::syntax::SequenceExprSyntax_*> *)(in_RSI + 2));
    ConstTokenOrSyntax::ConstTokenOrSyntax((ConstTokenOrSyntax *)in_RDI,in_stack_ffffffffffffffb8);
  }
  else {
    ConstTokenOrSyntax::ConstTokenOrSyntax(in_RSI,in_RDI);
    pIVar1 = in_RDI;
  }
  return (ConstTokenOrSyntax *)pIVar1;
}

Assistant:

ConstTokenOrSyntax BinarySequenceExprSyntax::getChild(size_t index) const {
    switch (index) {
        case 0: return left.get();
        case 1: return op;
        case 2: return right.get();
        default: return nullptr;
    }
}